

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

int __thiscall el::base::RegisteredLoggers::remove(RegisteredLoggers *this,char *__filename)

{
  int iVar1;
  Logger *pLVar2;
  Logger *extraout_RAX;
  
  pLVar2 = (Logger *)std::__cxx11::string::compare(__filename);
  iVar1 = (int)pLVar2;
  if (iVar1 != 0) {
    pLVar2 = utils::
             Registry<el::Logger,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::get(&this->
                    super_Registry<el::Logger,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__filename)
    ;
    if (pLVar2 != (Logger *)0x0) {
      (*(this->
        super_Registry<el::Logger,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ).
        super_AbstractRegistry<el::Logger,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*>_>_>_>
        .super_ThreadSafe._vptr_ThreadSafe[2])(this);
      utils::
      Registry<el::Logger,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::unregister(&this->
                    super_Registry<el::Logger,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ,&pLVar2->m_id);
      pLVar2 = extraout_RAX;
    }
  }
  return (int)CONCAT71((int7)((ulong)pLVar2 >> 8),iVar1 != 0);
}

Assistant:

bool RegisteredLoggers::remove(const std::string& id) {
  if (id == base::consts::kDefaultLoggerId) {
    return false;
  }
  // get has internal lock
  Logger* logger = base::utils::Registry<Logger, std::string>::get(id);
  if (logger != nullptr) {
    // unregister has internal lock
    unregister(logger);
  }
  return true;
}